

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord2d> *value)

{
  bool bVar1;
  texcoord2d v;
  texcoord2d tStack_28;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,&tStack_28);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2d>::operator=(value,&tStack_28);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord2d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord2d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}